

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O0

ArenaStringPtr *
google::protobuf::internal::TcParser::RefAt<google::protobuf::internal::ArenaStringPtr>
          (void *x,size_t offset)

{
  ArenaStringPtr *pAVar1;
  ArenaStringPtr *target;
  size_t offset_local;
  void *x_local;
  
  pAVar1 = (ArenaStringPtr *)((long)x + offset);
  if (((ulong)pAVar1 & 7) != 0) {
    AlignFail(pAVar1);
    abort();
  }
  return pAVar1;
}

Assistant:

static inline T& RefAt(void* x, size_t offset) {
    T* target = reinterpret_cast<T*>(static_cast<char*>(x) + offset);
#if !defined(NDEBUG) && !(defined(_MSC_VER) && defined(_M_IX86))
    // Check the alignment in debug mode, except in 32-bit msvc because it does
    // not respect the alignment as expressed by `alignof(T)`
    if (PROTOBUF_PREDICT_FALSE(
            reinterpret_cast<uintptr_t>(target) % alignof(T) != 0)) {
      AlignFail(std::integral_constant<size_t, alignof(T)>(),
                reinterpret_cast<uintptr_t>(target));
      // Explicit abort to let compilers know this code-path does not return
      abort();
    }
#endif
    return *target;
  }